

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.c
# Opt level: O0

int inthissection(Dwarf_Section_s *sec,Dwarf_Small *ptr)

{
  Dwarf_Small *ptr_local;
  Dwarf_Section_s *sec_local;
  
  if (sec->dss_data == (Dwarf_Small *)0x0) {
    sec_local._4_4_ = 0;
  }
  else if (ptr < sec->dss_data) {
    sec_local._4_4_ = 0;
  }
  else if (ptr < sec->dss_data + sec->dss_size) {
    sec_local._4_4_ = 1;
  }
  else {
    sec_local._4_4_ = 0;
  }
  return sec_local._4_4_;
}

Assistant:

static int
inthissection(struct Dwarf_Section_s *sec,Dwarf_Small *ptr)
{
    if (!sec->dss_data) {
        return FALSE;
    }
    if (ptr < sec->dss_data ) {
        return FALSE;
    }
    if (ptr >= (sec->dss_data + sec->dss_size) ) {
        return FALSE;
    }
    return TRUE;
}